

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spectrum.cpp
# Opt level: O2

optional<unsigned_char> __thiscall
Storage::Tape::ZXSpectrum::Parser::get_byte(Parser *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  byte bVar1;
  SymbolType SVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  
  iVar4 = 8;
  bVar3 = 0;
  while( true ) {
    bVar5 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar5) {
      bVar1 = bVar3 << 4 | bVar3 >> 4;
      bVar1 = bVar1 >> 2 & 0x33 | (bVar1 & 0x33) << 2;
      if (this->machine_type_ == Enterprise) {
        bVar3 = bVar1 >> 1 & 0x55 | (bVar1 & 0x55) * '\x02';
      }
      this->checksum_ = this->checksum_ ^ bVar3;
      return (_Optional_base<unsigned_char,_true,_true>)
             (_Optional_base<unsigned_char,_true,_true>)(bVar3 | 0x100);
    }
    SVar2 = Parser<Storage::Tape::ZXSpectrum::SymbolType>::get_next_symbol
                      ((Parser<Storage::Tape::ZXSpectrum::SymbolType> *)this,tape);
    if (One < SVar2) break;
    bVar3 = bVar3 * '\x02' | SVar2 == One;
  }
  return (_Optional_base<unsigned_char,_true,_true>)
         (_Optional_payload<unsigned_char,_true,_true,_true>)0x0;
}

Assistant:

std::optional<uint8_t> Parser::get_byte(const std::shared_ptr<Storage::Tape::Tape> &tape) {
	uint8_t result = 0;
	for(int c = 0; c < 8; c++) {
		const SymbolType symbol = get_next_symbol(tape);
		if(symbol != SymbolType::One && symbol != SymbolType::Zero) return std::nullopt;
		result = uint8_t((result << 1) | (symbol == SymbolType::One));
	}

	if(should_flip_bytes()) {
		result = CRC::reverse_byte(result);
	}

	checksum_ ^= result;
	return result;
}